

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  uint tableLog_local;
  U8 *nbAdditionalBits_local;
  U32 *baseValue_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  ZSTD_seqSymbol *dt_local;
  
  ZSTD_buildFSETable_body_default
            (dt,normalizedCounter,maxSymbolValue,baseValue,nbAdditionalBits,tableLog,wksp,wkspSize);
  return;
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}